

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void * probe_contiguous(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t nb,
                       MMUAccessType access_type,int mmu_idx,uintptr_t raddr)

{
  uint size;
  uint uVar1;
  target_ulong addr_00;
  void *pvVar2;
  uint32_t nb_pg2;
  uint32_t nb_pg1;
  char *host2;
  char *host1;
  uintptr_t raddr_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  uint32_t nb_local;
  target_ulong addr_local;
  CPUPPCState_conflict2 *env_local;
  
  uVar1 = (uint)addr | 0xfffff000;
  size = -uVar1;
  if (size < nb) {
    env_local = (CPUPPCState_conflict2 *)probe_access_ppc64(env,addr,size,access_type,mmu_idx,raddr)
    ;
    addr_00 = addr_add(env,addr,(ulong)size);
    pvVar2 = probe_access_ppc64(env,addr_00,nb + uVar1,access_type,mmu_idx,raddr);
    if (pvVar2 != (void *)((long)env_local->gpr + (ulong)size)) {
      env_local = (CPUPPCState_conflict2 *)0x0;
    }
  }
  else {
    env_local = (CPUPPCState_conflict2 *)probe_access_ppc64(env,addr,nb,access_type,mmu_idx,raddr);
  }
  return env_local;
}

Assistant:

static void *probe_contiguous(CPUPPCState *env, target_ulong addr, uint32_t nb,
                              MMUAccessType access_type, int mmu_idx,
                              uintptr_t raddr)
{
    char *host1, *host2;
    uint32_t nb_pg1, nb_pg2;

#ifdef _MSC_VER
    nb_pg1 = 0 - (addr | TARGET_PAGE_MASK);
#else
    nb_pg1 = -(addr | TARGET_PAGE_MASK);
#endif
    if (likely(nb <= nb_pg1)) {
        /* The entire operation is on a single page.  */
        return probe_access(env, addr, nb, access_type, mmu_idx, raddr);
    }

    /* The operation spans two pages.  */
    nb_pg2 = nb - nb_pg1;
    host1 = probe_access(env, addr, nb_pg1, access_type, mmu_idx, raddr);
    addr = addr_add(env, addr, nb_pg1);
    host2 = probe_access(env, addr, nb_pg2, access_type, mmu_idx, raddr);

    /* If the two host pages are contiguous, optimize.  */
    if (host2 == host1 + nb_pg1) {
        return host1;
    }
    return NULL;
}